

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O0

void __thiscall Minefield::unflag(Minefield *this,int x,int y)

{
  bool bVar1;
  runtime_error *this_00;
  reference this_01;
  reference local_38 [2];
  int local_18;
  int local_14;
  int y_local;
  int x_local;
  Minefield *this_local;
  
  local_18 = y;
  local_14 = x;
  _y_local = this;
  checkPos(this,x,y);
  checkRunning(this);
  bVar1 = isOpen(this,local_14,local_18);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Can\'t remove flag on opened field.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = isFlagged(this,local_14,local_18);
  if (bVar1) {
    this_01 = std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::operator[](&this->flags,(long)local_14);
    local_38[0] = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,(long)local_18);
    std::_Bit_reference::operator=(local_38,false);
    this->flag_cnt = this->flag_cnt + -1;
  }
  return;
}

Assistant:

void Minefield::unflag(int x, int y) {
    checkPos(x, y);
    checkRunning();

    if (isOpen(x, y)) {
        throw std::runtime_error("Can't remove flag on opened field.");
    }

    if (isFlagged(x, y)) {
        flags[x][y] = false;
        flag_cnt--;
    }
}